

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_IsVisible(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AActor *other;
  AActor *lookee;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003ff2ab;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ff292:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ff2ab:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x54a,
                  "int AF_AActor_IsVisible(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  lookee = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (lookee == (AActor *)0x0) goto LAB_003ff194;
    bVar2 = DObject::IsKindOf((DObject *)lookee,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ff2ab;
    }
  }
  else {
    if (lookee != (AActor *)0x0) goto LAB_003ff292;
LAB_003ff194:
    lookee = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003ff2ca;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003ff29b:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ff2ca:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x54b,
                  "int AF_AActor_IsVisible(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  other = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_003ff1f9;
    bVar2 = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "other == NULL || other->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ff2ca;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_003ff29b;
LAB_003ff1f9:
    other = (AActor *)0x0;
  }
  if ((uint)numparam < 3) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (param[2].field_0.field_3.Type == '\0') {
      pVVar1 = param + 2;
      if (numparam == 3) {
        param = defaultparam->Array;
        if ((param[3].field_0.field_3.Type == '\x03') && (param[3].field_0.field_1.atag == 0)) {
LAB_003ff24e:
          bVar2 = P_IsVisible(lookee,other,(uint)((pVVar1->field_0).i != 0),
                              (FLookExParams *)param[3].field_0.field_1.a);
          if (numret < 1) {
            iVar3 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                            ,0x54e,
                            "int AF_AActor_IsVisible(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            VMReturn::SetInt(ret,(uint)bVar2);
            iVar3 = 1;
          }
          return iVar3;
        }
        pcVar4 = 
        "(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
        ;
      }
      else {
        if ((param[3].field_0.field_3.Type == '\x03') && (param[3].field_0.field_1.atag == 0))
        goto LAB_003ff24e;
        pcVar4 = "(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x54d,
                    "int AF_AActor_IsVisible(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar4 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x54c,"int AF_AActor_IsVisible(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, IsVisible)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(other, AActor);
	PARAM_BOOL(allaround);
	PARAM_POINTER_DEF(params, FLookExParams);
	ACTION_RETURN_BOOL(P_IsVisible(self, other, allaround, params));
}